

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O0

void mu_draw_rect(mu_Context *ctx,mu_Rect rect,mu_Color color)

{
  mu_Command *pmVar1;
  mu_Rect mVar2;
  void *local_40;
  mu_Vec2 local_38;
  mu_Command *cmd;
  mu_Context *ctx_local;
  mu_Color color_local;
  mu_Rect rect_local;
  
  mVar2 = mu_get_clip_rect(ctx);
  mVar2 = intersect_rects(rect,mVar2);
  local_40 = mVar2._0_8_;
  local_38 = mVar2._8_8_;
  rect_local.x = mVar2.w;
  rect_local.y = mVar2.h;
  if ((0 < rect_local.x) && (0 < rect_local.y)) {
    pmVar1 = mu_push_command(ctx,3,0x1c);
    (pmVar1->jump).dst = local_40;
    (pmVar1->text).pos = local_38;
    (pmVar1->rect).color = color;
  }
  return;
}

Assistant:

void mu_draw_rect(mu_Context *ctx, mu_Rect rect, mu_Color color) {
  mu_Command *cmd;
  rect = intersect_rects(rect, mu_get_clip_rect(ctx));
  if (rect.w > 0 && rect.h > 0) {
    cmd = mu_push_command(ctx, MU_COMMAND_RECT, sizeof(mu_RectCommand));
    cmd->rect.rect = rect;
    cmd->rect.color = color;
  }
}